

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_rpc_sendstring_client.c
# Opt level: O0

int main(int argc,char **argv)

{
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  amqp_rpc_reply_t x_04;
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  long in_RSI;
  int in_EDI;
  undefined1 auVar4 [16];
  size_t body_received;
  size_t body_target;
  amqp_basic_properties_t *p;
  amqp_basic_deliver_t *d;
  int result;
  amqp_frame_t frame;
  amqp_basic_properties_t props;
  amqp_queue_declare_ok_t *r;
  amqp_bytes_t reply_to_queue;
  amqp_connection_state_t conn;
  amqp_socket_t *socket;
  char *messagebody;
  char *routingkey;
  char *exchange;
  int status;
  int port;
  char *hostname;
  undefined8 in_stack_fffffffffffffd18;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  char *context;
  undefined8 uVar8;
  char *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  ulong local_270;
  byte local_248 [2];
  ushort local_246;
  int local_240;
  undefined4 uStack_23c;
  ulong in_stack_fffffffffffffdc8;
  uint *in_stack_fffffffffffffdd0;
  undefined1 local_218 [32];
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  char local_198 [8];
  undefined1 local_190 [16];
  undefined1 local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_d0 [16];
  ulong local_c0;
  ulong local_b8;
  undefined8 *local_a0;
  ulong local_98 [4];
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  long local_10;
  int local_4;
  
  uVar1 = (uint)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  local_4 = 0;
  local_40 = 0;
  if (in_EDI < 6) {
    fprintf(_stderr,"usage:\namqp_rpc_sendstring_client host port exchange routingkey messagebody\n"
           );
    local_4 = 1;
  }
  else {
    local_18 = *(undefined8 *)(in_RSI + 8);
    local_10 = in_RSI;
    local_1c = atoi(*(char **)(in_RSI + 0x10));
    local_28 = *(undefined8 *)(local_10 + 0x18);
    local_30 = *(undefined8 *)(local_10 + 0x20);
    local_38 = *(undefined8 *)(local_10 + 0x28);
    local_48 = amqp_new_connection();
    local_40 = amqp_tcp_socket_new(local_48);
    if (local_40 == 0) {
      die("creating TCP socket");
    }
    local_20 = amqp_socket_open(local_40,local_18,local_1c);
    if (local_20 != 0) {
      die("opening TCP socket");
    }
    amqp_login(local_78,local_48,"/",0,0x20000,0,(ulong)uVar1 << 0x20,"guest","guest");
    x.reply._0_8_ = in_stack_fffffffffffffd68;
    x._0_8_ = in_stack_fffffffffffffd60;
    x.reply.decoded = (void *)in_stack_fffffffffffffd70;
    x._24_8_ = in_stack_fffffffffffffd78;
    die_on_amqp_error(x,in_stack_fffffffffffffd50);
    amqp_channel_open(local_48,1);
    amqp_get_rpc_reply(local_98,local_48);
    x_00.reply._0_8_ = in_stack_fffffffffffffd68;
    x_00._0_8_ = in_stack_fffffffffffffd60;
    x_00.reply.decoded = (void *)in_stack_fffffffffffffd70;
    x_00._24_8_ = in_stack_fffffffffffffd78;
    die_on_amqp_error(x_00,in_stack_fffffffffffffd50);
    local_a0 = (undefined8 *)
               amqp_queue_declare(local_48,1,_amqp_empty_bytes,_amqp_socket_open,0,0,
                                  local_98[0] & 0xffffffff00000000,1,_amqp_empty_table,_usleep);
    amqp_get_rpc_reply(&local_c0,local_48);
    x_01.reply._0_8_ = in_stack_fffffffffffffd68;
    x_01._0_8_ = in_stack_fffffffffffffd60;
    x_01.reply.decoded = (void *)in_stack_fffffffffffffd70;
    x_01._24_8_ = in_stack_fffffffffffffd78;
    die_on_amqp_error(x_01,in_stack_fffffffffffffd50);
    local_d0 = amqp_bytes_malloc_dup(*local_a0,local_a0[1]);
    local_58 = local_d0;
    if (local_d0._8_8_ == 0) {
      fprintf(_stderr,"Out of memory while copying queue name");
      local_4 = 1;
    }
    else {
      local_198[0] = '\0';
      local_198[1] = -0x6a;
      local_198[2] = '\0';
      local_198[3] = '\0';
      local_1a8 = amqp_cstring_bytes("text/plain");
      local_160 = 2;
      local_190 = local_1a8;
      local_1b8 = amqp_bytes_malloc_dup(local_58._0_8_,local_58._8_8_);
      local_148 = local_1b8;
      if (local_1b8._8_8_ == 0) {
        fprintf(_stderr,"Out of memory while copying queue name");
        local_4 = 1;
      }
      else {
        local_1c8 = amqp_cstring_bytes("1");
        uVar3 = local_48;
        local_158 = local_1c8;
        local_1d8 = amqp_cstring_bytes(local_28);
        local_1e8 = amqp_cstring_bytes(local_30);
        auVar4 = amqp_cstring_bytes(local_38);
        local_1f0 = auVar4._8_8_;
        uVar8 = auVar4._0_8_;
        context = local_198;
        uVar5 = local_c0 & 0xffffffff00000000;
        uVar6 = local_b8 & 0xffffffff00000000;
        local_1f8 = uVar8;
        amqp_basic_publish(uVar3,1,local_1d8._0_8_,local_1d8._8_8_,local_1e8._0_8_,local_1e8._8_8_,
                           uVar5,uVar6,context,auVar4);
        uVar7 = (undefined4)(uVar6 >> 0x20);
        die_on_error((int)((ulong)uVar8 >> 0x20),context);
        amqp_bytes_free(local_148._0_8_,local_148._8_8_);
        amqp_basic_consume(local_48,1,local_58._0_8_,local_58._8_8_,_amqp_empty_bytes,
                           _amqp_socket_open,uVar5 & 0xffffffff00000000,CONCAT44(uVar7,1),
                           (ulong)context & 0xffffffff00000000,_amqp_empty_table,_usleep);
        amqp_get_rpc_reply(local_218,local_48);
        x_02.reply._0_8_ = in_stack_fffffffffffffd68;
        x_02._0_8_ = in_stack_fffffffffffffd60;
        x_02.reply.decoded = (void *)in_stack_fffffffffffffd70;
        x_02._24_8_ = in_stack_fffffffffffffd78;
        die_on_amqp_error(x_02,in_stack_fffffffffffffd50);
        amqp_bytes_free(local_58._0_8_,local_58._8_8_);
        do {
          do {
            amqp_maybe_release_buffers(local_48);
            uVar1 = amqp_simple_wait_frame(local_48,local_248);
            printf("Result: %d\n",(ulong)uVar1);
            if ((int)uVar1 < 0) goto LAB_00101b5a;
            printf("Frame type: %d channel: %d\n",(ulong)local_248[0],(ulong)local_246);
          } while (local_248[0] != 1);
          uVar3 = amqp_method_name(local_240);
          printf("Method: %s\n",uVar3);
        } while (local_240 != 0x3c003c);
        printf("Delivery: %u exchange: %.*s routingkey: %.*s\n",
               *(ulong *)(in_stack_fffffffffffffdc8 + 0x10) & 0xffffffff,
               *(ulong *)(in_stack_fffffffffffffdc8 + 0x20) & 0xffffffff,
               *(undefined8 *)(in_stack_fffffffffffffdc8 + 0x28),
               *(ulong *)(in_stack_fffffffffffffdc8 + 0x30) & 0xffffffff,
               *(undefined8 *)(in_stack_fffffffffffffdc8 + 0x38));
        iVar2 = amqp_simple_wait_frame(local_48,local_248);
        if (-1 < iVar2) {
          if (local_248[0] != 2) {
            fprintf(_stderr,"Expected header!");
            abort();
          }
          if ((*in_stack_fffffffffffffdd0 & 0x8000) != 0) {
            printf("Content-type: %.*s\n",*(ulong *)(in_stack_fffffffffffffdd0 + 2) & 0xffffffff,
                   *(undefined8 *)(in_stack_fffffffffffffdd0 + 4));
          }
          printf("----\n");
          local_270 = 0;
          uVar5 = in_stack_fffffffffffffdc8;
          while (local_270 < in_stack_fffffffffffffdc8) {
            iVar2 = amqp_simple_wait_frame(local_48,local_248);
            if (iVar2 < 0) break;
            if (local_248[0] != 3) {
              fprintf(_stderr,"Expected body!");
              abort();
            }
            local_270 = CONCAT44(uStack_23c,local_240) + local_270;
            amqp_dump(in_stack_fffffffffffffdd0,uVar5);
          }
        }
LAB_00101b5a:
        amqp_channel_close(&stack0xfffffffffffffd70,local_48,1,200);
        x_03.reply._0_8_ = in_stack_fffffffffffffd68;
        x_03._0_8_ = in_stack_fffffffffffffd60;
        x_03.reply.decoded = (void *)in_stack_fffffffffffffd70;
        x_03._24_8_ = in_stack_fffffffffffffd78;
        die_on_amqp_error(x_03,in_stack_fffffffffffffd50);
        amqp_connection_close(&stack0xfffffffffffffd50,local_48,200);
        x_04.reply._0_8_ = in_stack_fffffffffffffd68;
        x_04._0_8_ = in_stack_fffffffffffffd60;
        x_04.reply.decoded = (void *)in_stack_fffffffffffffd70;
        x_04._24_8_ = in_stack_fffffffffffffd78;
        die_on_amqp_error(x_04,in_stack_fffffffffffffd50);
        iVar2 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
        amqp_destroy_connection(local_48);
        die_on_error(iVar2,in_stack_fffffffffffffd60);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *routingkey;
  char const *messagebody;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;
  amqp_bytes_t reply_to_queue;

  if (argc < 6) { /* minimum number of mandatory arguments */
    fprintf(stderr, "usage:\namqp_rpc_sendstring_client host port exchange routingkey messagebody\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  routingkey = argv[4];
  messagebody = argv[5];

  /*
     establish a channel that is used to connect RabbitMQ server
  */

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  /*
     create private reply_to queue
  */

  {
    amqp_queue_declare_ok_t *r = amqp_queue_declare(conn, 1, amqp_empty_bytes, 0, 0, 0, 1, amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring queue");
    reply_to_queue = amqp_bytes_malloc_dup(r->queue);
    if (reply_to_queue.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
  }

  /*
     send the message
  */

  {
    /*
      set properties
    */
    amqp_basic_properties_t props;
    props._flags = AMQP_BASIC_CONTENT_TYPE_FLAG |
                   AMQP_BASIC_DELIVERY_MODE_FLAG |
                   AMQP_BASIC_REPLY_TO_FLAG |
                   AMQP_BASIC_CORRELATION_ID_FLAG;
    props.content_type = amqp_cstring_bytes("text/plain");
    props.delivery_mode = 2; /* persistent delivery mode */
    props.reply_to = amqp_bytes_malloc_dup(reply_to_queue);
    if (props.reply_to.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
    props.correlation_id = amqp_cstring_bytes("1");

    /*
      publish
    */
    die_on_error(amqp_basic_publish(conn,
                                    1,
                                    amqp_cstring_bytes(exchange),
                                    amqp_cstring_bytes(routingkey),
                                    0,
                                    0,
                                    &props,
                                    amqp_cstring_bytes(messagebody)),
                 "Publishing");

    amqp_bytes_free(props.reply_to);
  }

  /*
    wait an answer
  */

  {
    amqp_basic_consume(conn, 1, reply_to_queue, amqp_empty_bytes, 0, 1, 0, amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Consuming");
    amqp_bytes_free(reply_to_queue);

    {
      amqp_frame_t frame;
      int result;

      amqp_basic_deliver_t *d;
      amqp_basic_properties_t *p;
      size_t body_target;
      size_t body_received;

      while (1) {
        amqp_maybe_release_buffers(conn);
        result = amqp_simple_wait_frame(conn, &frame);
        printf("Result: %d\n", result);
        if (result < 0) {
          break;
        }

        printf("Frame type: %d channel: %d\n", frame.frame_type, frame.channel);
        if (frame.frame_type != AMQP_FRAME_METHOD) {
          continue;
        }

        printf("Method: %s\n", amqp_method_name(frame.payload.method.id));
        if (frame.payload.method.id != AMQP_BASIC_DELIVER_METHOD) {
          continue;
        }

        d = (amqp_basic_deliver_t *) frame.payload.method.decoded;
        printf("Delivery: %u exchange: %.*s routingkey: %.*s\n",
               (unsigned) d->delivery_tag,
               (int) d->exchange.len, (char *) d->exchange.bytes,
               (int) d->routing_key.len, (char *) d->routing_key.bytes);

        result = amqp_simple_wait_frame(conn, &frame);
        if (result < 0) {
          break;
        }

        if (frame.frame_type != AMQP_FRAME_HEADER) {
          fprintf(stderr, "Expected header!");
          abort();
        }
        p = (amqp_basic_properties_t *) frame.payload.properties.decoded;
        if (p->_flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
          printf("Content-type: %.*s\n",
                 (int) p->content_type.len, (char *) p->content_type.bytes);
        }
        printf("----\n");

        body_target = frame.payload.properties.body_size;
        body_received = 0;

        while (body_received < body_target) {
          result = amqp_simple_wait_frame(conn, &frame);
          if (result < 0) {
            break;
          }

          if (frame.frame_type != AMQP_FRAME_BODY) {
            fprintf(stderr, "Expected body!");
            abort();
          }

          body_received += frame.payload.body_fragment.len;
          assert(body_received <= body_target);

          amqp_dump(frame.payload.body_fragment.bytes,
                    frame.payload.body_fragment.len);
        }

        if (body_received != body_target) {
          /* Can only happen when amqp_simple_wait_frame returns <= 0 */
          /* We break here to close the connection */
          break;
        }

        /* everything was fine, we can quit now because we received the reply */
        break;
      }

    }
  }

  /*
     closing
  */

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  return 0;
}